

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int makemask(char *smask,int count)

{
  char *pcVar1;
  int in_ESI;
  char *in_RDI;
  int mask;
  uint local_10;
  
  pcVar1 = strchr(in_RDI,99);
  local_10 = (uint)(pcVar1 != (char *)0x0);
  pcVar1 = strchr(in_RDI,0x72);
  if (pcVar1 != (char *)0x0) {
    local_10 = local_10 | 2;
  }
  pcVar1 = strchr(in_RDI,0x6c);
  if (pcVar1 != (char *)0x0) {
    local_10 = local_10 | 4;
  }
  if (0 < in_ESI) {
    local_10 = local_10 | 8;
  }
  return local_10;
}

Assistant:

static int makemask(const char *smask, int count)
{
  int mask = 0;
  if (strchr(smask, 'c')) mask |= LUA_MASKCALL;
  if (strchr(smask, 'r')) mask |= LUA_MASKRET;
  if (strchr(smask, 'l')) mask |= LUA_MASKLINE;
  if (count > 0) mask |= LUA_MASKCOUNT;
  return mask;
}